

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

void __thiscall
ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
stop(Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
     *this)

{
  std::mutex::lock(&this->m);
  this->to_stop = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m);
  return;
}

Assistant:

void stop()
		{
			std::lock_guard<std::mutex> l{m};
			to_stop = true;
		}